

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_make_conserved(REF_DBL *primitive,REF_DBL *conserved)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = *primitive;
  dVar2 = primitive[1];
  dVar3 = primitive[2];
  dVar4 = primitive[3];
  dVar5 = primitive[4];
  *conserved = dVar1;
  conserved[1] = dVar1 * dVar2;
  conserved[2] = dVar1 * dVar3;
  conserved[3] = dVar1 * dVar4;
  conserved[4] = (dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3) * dVar1 * 0.5 +
                 dVar5 / 0.3999999999999999;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_make_conserved(REF_DBL *primitive,
                                           REF_DBL *conserved) {
  REF_DBL rho, u, v, w, p, e;
  REF_DBL gamma = 1.4;
  rho = primitive[0];
  u = primitive[1];
  v = primitive[2];
  w = primitive[3];
  p = primitive[4];
  e = p / (gamma - 1.0) + 0.5 * rho * (u * u + v * v + w * w);
  conserved[0] = rho;
  conserved[1] = rho * u;
  conserved[2] = rho * v;
  conserved[3] = rho * w;
  conserved[4] = e;

  return REF_SUCCESS;
}